

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall cmFileCopier::CheckPermissions(cmFileCopier *this,string *arg,mode_t *permissions)

{
  char *__s;
  cmCommand *this_00;
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  bVar1 = cmFSPermissions::stringToModeT(arg,permissions);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    __s = this->Name;
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198," given invalid permission \"",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return bVar1;
}

Assistant:

bool cmFileCopier::CheckPermissions(std::string const& arg,
                                    mode_t& permissions)
{
  if (!cmFSPermissions::stringToModeT(arg, permissions)) {
    std::ostringstream e;
    e << this->Name << " given invalid permission \"" << arg << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }
  return true;
}